

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

Vec_Ptr_t * Llb_ManFlowMinCut(Aig_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  iVar8 = p->nRegs;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < iVar8 - 1U) {
    iVar7 = iVar8;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar7;
  if (iVar7 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar7 << 3);
  }
  pVVar4->pArray = ppvVar5;
  pVVar6 = p->vObjs;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      pvVar3 = pVVar6->pArray[lVar9];
      if ((((pvVar3 != (void *)0x0) && (*(long *)((long)pvVar3 + 0x28) != 0)) &&
          (*(int *)((long)pvVar3 + 0x20) == p->nTravIds)) &&
         (((*(byte *)((long)pvVar3 + 0x18) & 0x10) != 0 ||
          (*(int *)(*(long *)((long)pvVar3 + 0x28) + 0x20) != p->nTravIds)))) {
        uVar1 = pVVar4->nSize;
        uVar2 = pVVar4->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
            }
            iVar8 = 0x10;
          }
          else {
            iVar8 = uVar2 * 2;
            if (iVar8 <= (int)uVar2) goto LAB_00834387;
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = iVar8;
        }
LAB_00834387:
        pVVar4->nSize = uVar1 + 1;
        pVVar4->pArray[(int)uVar1] = pvVar3;
      }
      lVar9 = lVar9 + 1;
      pVVar6 = p->vObjs;
    } while (lVar9 < pVVar6->nSize);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Llb_ManFlowMinCut( Aig_Man_t * p )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int i;
    // collect the cut nodes
    vMinCut = Vec_PtrAlloc( Aig_ManRegNum(p) );
    Aig_ManForEachObj( p, pObj, i )
    {
        // node without flow is not a cut node
        if ( !Llb_ObjGetPath(pObj) )
            continue;
        // unvisited node is below the cut
        if ( !Aig_ObjIsTravIdCurrent(p, pObj) )
            continue;
        // add terminal with flow or node whose path is not visited
        if ( pObj->fMarkA || !Aig_ObjIsTravIdCurrent( p, Llb_ObjGetPath(pObj) ) )
            Vec_PtrPush( vMinCut, pObj );
    }
    return vMinCut;
}